

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

void __thiscall
Catch::Detail::unique_ptr<Catch::Detail::EnumInfo>::~unique_ptr
          (unique_ptr<Catch::Detail::EnumInfo> *this)

{
  EnumInfo *pEVar1;
  
  pEVar1 = this->m_ptr;
  if (pEVar1 != (EnumInfo *)0x0) {
    std::
    _Vector_base<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>
    ::~_Vector_base(&(pEVar1->m_values).
                     super__Vector_base<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>
                   );
  }
  operator_delete(pEVar1,0x28);
  return;
}

Assistant:

~unique_ptr() {
            delete m_ptr;
        }